

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_ctor_move(void)

{
  undefined8 local_40;
  undefined4 local_34;
  
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x56,"void api_dynamic_suite::dynamic_ctor_move()",true);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x57,"void api_dynamic_suite::dynamic_ctor_move()",true);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x58,"void api_dynamic_suite::dynamic_ctor_move()",&local_40,&local_34);
  local_40 = 4;
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x59,"void api_dynamic_suite::dynamic_ctor_move()",&local_40,&local_34);
  boost::detail::test_impl
            ("clone.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x5b,"void api_dynamic_suite::dynamic_ctor_move()",true);
  boost::detail::test_impl
            ("!clone.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x5c,"void api_dynamic_suite::dynamic_ctor_move()",true);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x5d,"void api_dynamic_suite::dynamic_ctor_move()",&local_40,&local_34);
  local_40 = 4;
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x5e,"void api_dynamic_suite::dynamic_ctor_move()",&local_40,&local_34);
  return;
}

Assistant:

void dynamic_ctor_move()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
    circular_view<int> clone(std::move(span));
    BOOST_TEST(clone.empty());
    BOOST_TEST(!clone.full());
    BOOST_TEST_EQ(clone.size(), 0);
    BOOST_TEST_EQ(clone.capacity(), 4);
}